

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O1

ProtoWriter * __thiscall
google::protobuf::util::converter::ProtoWriter::RenderPrimitiveField
          (ProtoWriter *this,Field *field,Type *type,DataPiece *data)

{
  bool bVar1;
  TypeInfo *pTVar2;
  pointer pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  StringPiece error_message;
  int iVar6;
  ProtoElement *pPVar7;
  undefined4 extraout_var;
  EnumDescriptor *pEVar8;
  string *psVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ProtoElement *pPVar10;
  undefined4 extraout_var_02;
  LocationTrackerInterface *pLVar11;
  pointer __p_2;
  pointer __p;
  Status local_e0;
  pointer local_b8;
  int32 local_ac;
  Type *local_a8;
  undefined1 local_a0 [8];
  Status status;
  undefined1 *local_70;
  char *local_50;
  size_t local_48;
  
  local_a8 = type;
  Status::Status((Status *)local_a0);
  pPVar10 = (this->element_)._M_t.
            super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
            .
            super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
            ._M_head_impl;
  if (pPVar10->proto3_ == false) {
    pPVar7 = (ProtoElement *)operator_new(0xa8);
    (this->element_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
    .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
    _M_head_impl = (ProtoElement *)0x0;
    ProtoElement::ProtoElement(pPVar7,pPVar10,field,local_a8,false);
    pPVar10 = (this->element_)._M_t.
              super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              .
              super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
              ._M_head_impl;
    (this->element_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
    .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
    _M_head_impl = pPVar7;
    if (pPVar10 != (ProtoElement *)0x0) {
      (**(code **)((long)(pPVar10->super_BaseElement)._vptr_BaseElement + 8))();
    }
  }
  switch(field->kind_) {
  case 0:
  case 0xb:
    pPVar10 = (this->element_)._M_t.
              super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              .
              super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
              ._M_head_impl;
    if (pPVar10->proto3_ == true) {
      pPVar7 = (ProtoElement *)operator_new(0xa8);
      (this->element_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
      _M_head_impl = (ProtoElement *)0x0;
      ProtoElement::ProtoElement(pPVar7,pPVar10,field,local_a8,false);
      pPVar10 = (this->element_)._M_t.
                super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                .
                super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                ._M_head_impl;
      (this->element_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
      _M_head_impl = pPVar7;
      if (pPVar10 != (ProtoElement *)0x0) {
        (**(code **)((long)(pPVar10->super_BaseElement)._vptr_BaseElement + 8))();
      }
    }
    psVar9 = (field->type_url_).ptr_;
    if (psVar9->_M_string_length == 0) {
      iVar6 = field->kind_;
      pEVar8 = Field_Kind_descriptor();
      psVar9 = protobuf::internal::NameOfEnum_abi_cxx11_(pEVar8,iVar6);
    }
    pcVar3 = (psVar9->_M_dataplus)._M_p;
    sVar4 = psVar9->_M_string_length;
    if ((long)sVar4 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar4,"size_t to int conversion");
    }
    DataPiece::ValueAsStringOrDefault_abi_cxx11_
              ((string *)((long)&status.error_message_.field_2 + 8),data,
               (StringPiece)ZEXT816(0x352cac));
    uVar5 = CONCAT44(status.error_message_.field_2._12_4_,status.error_message_.field_2._8_4_);
    if ((long)local_70 < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)local_70,"size_t to int conversion");
    }
    pPVar10 = (this->element_)._M_t.
              super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              .
              super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
              ._M_head_impl;
    if (pPVar10 == (ProtoElement *)0x0) {
      pLVar11 = (this->tracker_)._M_t.
                super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                .
                super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                ._M_head_impl;
    }
    else {
      pLVar11 = &pPVar10->super_LocationTrackerInterface;
    }
    (*this->listener_->_vptr_ErrorListener[3])(this->listener_,pLVar11,pcVar3,sVar4,uVar5,local_70);
    if ((undefined1 *)
        CONCAT44(status.error_message_.field_2._12_4_,status.error_message_.field_2._8_4_) !=
        &stack0xffffffffffffff98) {
      operator_delete((undefined1 *)
                      CONCAT44(status.error_message_.field_2._12_4_,
                               status.error_message_.field_2._8_4_));
    }
    iVar6 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                      (this);
    pPVar10 = ProtoElement::pop((ProtoElement *)CONCAT44(extraout_var_02,iVar6));
    goto LAB_0031ed46;
  case 1:
    anon_unknown_8::WriteDouble
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 2:
    anon_unknown_8::WriteFloat
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 3:
    anon_unknown_8::WriteInt64
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 4:
    anon_unknown_8::WriteUInt64
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 5:
    anon_unknown_8::WriteInt32
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 6:
    anon_unknown_8::WriteFixed64
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 7:
    anon_unknown_8::WriteFixed32
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 8:
    anon_unknown_8::WriteBool
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 9:
    anon_unknown_8::WriteString
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  default:
    DataPiece::ToString_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ != 0) {
      internal::StatusOrHelper::Crash((Status *)((long)&status.error_message_.field_2 + 8));
    }
    error_message.length_ = local_48;
    error_message.ptr_ = local_50;
    if ((long)local_48 < 0) {
      StringPiece::LogFatalSizeTooBig(local_48,"size_t to int conversion");
    }
    Status::Status(&local_e0,INVALID_ARGUMENT,error_message);
    Status::operator=((Status *)local_a0,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.error_message_._M_dataplus._M_p != &local_e0.error_message_.field_2) {
      operator_delete(local_e0.error_message_._M_dataplus._M_p);
    }
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~StatusOr((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&status.error_message_.field_2 + 8));
    goto LAB_0031ec3f;
  case 0xc:
    anon_unknown_8::WriteBytes
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 0xd:
    anon_unknown_8::WriteUInt32
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 0xe:
    local_ac = field->number_;
    pTVar2 = this->typeinfo_;
    psVar9 = (field->type_url_).ptr_;
    local_b8 = (psVar9->_M_dataplus)._M_p;
    sVar4 = psVar9->_M_string_length;
    if ((long)sVar4 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar4,"size_t to int conversion");
    }
    iVar6 = (*pTVar2->_vptr_TypeInfo[4])(pTVar2,local_b8,sVar4);
    WriteEnum((Status *)((long)&status.error_message_.field_2 + 8),local_ac,data,
              (Enum *)CONCAT44(extraout_var,iVar6),
              (this->stream_)._M_t.
              super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
              .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl,
              this->use_lower_camel_for_enums_,this->case_insensitive_enum_parsing_,
              this->ignore_unknown_enum_values_);
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 0xf:
    anon_unknown_8::WriteSFixed32
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 0x10:
    anon_unknown_8::WriteSFixed64
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 0x11:
    anon_unknown_8::WriteSInt32
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
    break;
  case 0x12:
    anon_unknown_8::WriteSInt64
              ((Status *)((long)&status.error_message_.field_2 + 8),field->number_,data,
               (this->stream_)._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    Status::operator=((Status *)local_a0,(Status *)((long)&status.error_message_.field_2 + 8));
  }
  if (local_70 != &stack0xffffffffffffffa0) {
    operator_delete(local_70);
  }
LAB_0031ec3f:
  pPVar10 = (this->element_)._M_t.
            super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
            .
            super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
            ._M_head_impl;
  bVar1 = pPVar10->proto3_;
  if (local_a0._0_4_ == OK) {
    if (bVar1 != false) goto LAB_0031ed59;
    iVar6 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                      (this);
    pPVar10 = ProtoElement::pop((ProtoElement *)CONCAT44(extraout_var_00,iVar6));
  }
  else {
    if (bVar1 != false) {
      pPVar7 = (ProtoElement *)operator_new(0xa8);
      (this->element_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
      _M_head_impl = (ProtoElement *)0x0;
      ProtoElement::ProtoElement(pPVar7,pPVar10,field,local_a8,false);
      pPVar10 = (this->element_)._M_t.
                super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                .
                super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                ._M_head_impl;
      (this->element_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
      _M_head_impl = pPVar7;
      if (pPVar10 != (ProtoElement *)0x0) {
        (**(code **)((long)(pPVar10->super_BaseElement)._vptr_BaseElement + 8))();
      }
    }
    iVar6 = field->kind_;
    pEVar8 = Field_Kind_descriptor();
    psVar9 = protobuf::internal::NameOfEnum_abi_cxx11_(pEVar8,iVar6);
    pcVar3 = (psVar9->_M_dataplus)._M_p;
    sVar4 = psVar9->_M_string_length;
    if ((long)sVar4 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar4,"size_t to int conversion");
    }
    uVar5 = status._0_8_;
    if ((long)status.error_message_._M_dataplus._M_p < 0) {
      StringPiece::LogFatalSizeTooBig
                ((size_t)status.error_message_._M_dataplus._M_p,"size_t to int conversion");
    }
    pPVar10 = (this->element_)._M_t.
              super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              .
              super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
              ._M_head_impl;
    if (pPVar10 == (ProtoElement *)0x0) {
      pLVar11 = (this->tracker_)._M_t.
                super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                .
                super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                ._M_head_impl;
    }
    else {
      pLVar11 = &pPVar10->super_LocationTrackerInterface;
    }
    (*this->listener_->_vptr_ErrorListener[3])
              (this->listener_,pLVar11,pcVar3,sVar4,uVar5,status.error_message_._M_dataplus._M_p);
    iVar6 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                      (this);
    pPVar10 = ProtoElement::pop((ProtoElement *)CONCAT44(extraout_var_01,iVar6));
  }
LAB_0031ed46:
  pPVar7 = (this->element_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
           ._M_head_impl;
  (this->element_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
  _M_head_impl = pPVar10;
  if (pPVar7 != (ProtoElement *)0x0) {
    (**(code **)((long)(pPVar7->super_BaseElement)._vptr_BaseElement + 8))();
  }
LAB_0031ed59:
  if ((size_type *)status._0_8_ != &status.error_message_._M_string_length) {
    operator_delete((void *)status._0_8_);
  }
  return this;
}

Assistant:

ProtoWriter* ProtoWriter::RenderPrimitiveField(
    const google::protobuf::Field& field, const google::protobuf::Type& type,
    const DataPiece& data) {
  Status status;

  // Pushing a ProtoElement and then pop it off at the end for 2 purposes:
  // error location reporting and required field accounting.
  //
  // For proto3, since there is no required field tracking, we only need to push
  // ProtoElement for error cases.
  if (!element_->proto3()) {
    element_.reset(new ProtoElement(element_.release(), &field, type, false));
  }

  if (field.kind() == google::protobuf::Field::TYPE_UNKNOWN ||
      field.kind() == google::protobuf::Field::TYPE_MESSAGE) {
    // Push a ProtoElement for location reporting purposes.
    if (element_->proto3()) {
      element_.reset(new ProtoElement(element_.release(), &field, type, false));
    }
    InvalidValue(field.type_url().empty()
                     ? google::protobuf::Field_Kind_Name(field.kind())
                     : field.type_url(),
                 data.ValueAsStringOrDefault(""));
    element_.reset(element()->pop());
    return this;
  }

  switch (field.kind()) {
    case google::protobuf::Field::TYPE_INT32: {
      status = WriteInt32(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_SFIXED32: {
      status = WriteSFixed32(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_SINT32: {
      status = WriteSInt32(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_FIXED32: {
      status = WriteFixed32(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_UINT32: {
      status = WriteUInt32(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_INT64: {
      status = WriteInt64(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_SFIXED64: {
      status = WriteSFixed64(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_SINT64: {
      status = WriteSInt64(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_FIXED64: {
      status = WriteFixed64(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_UINT64: {
      status = WriteUInt64(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_DOUBLE: {
      status = WriteDouble(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_FLOAT: {
      status = WriteFloat(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_BOOL: {
      status = WriteBool(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_BYTES: {
      status = WriteBytes(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_STRING: {
      status = WriteString(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_ENUM: {
      status = WriteEnum(
          field.number(), data, typeinfo_->GetEnumByTypeUrl(field.type_url()),
          stream_.get(), use_lower_camel_for_enums_,
          case_insensitive_enum_parsing_, ignore_unknown_enum_values_);
      break;
    }
    default:  // TYPE_GROUP or TYPE_MESSAGE
      status =
          Status(util::error::INVALID_ARGUMENT, data.ToString().value());
  }

  if (!status.ok()) {
    // Push a ProtoElement for location reporting purposes.
    if (element_->proto3()) {
      element_.reset(new ProtoElement(element_.release(), &field, type, false));
    }
    InvalidValue(google::protobuf::Field_Kind_Name(field.kind()),
                 status.message());
    element_.reset(element()->pop());
    return this;
  }

  if (!element_->proto3()) element_.reset(element()->pop());

  return this;
}